

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed.cc
# Opt level: O0

bool tinyusdz::tydra::
     EvaluateTypedAttribute<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
               (Stage *stage,
               TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
               *tattr,string *attr_name,
               vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *value_out,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  double t;
  allocator local_7a1;
  string local_7a0 [32];
  fmt local_780 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  string local_740;
  allocator local_719;
  string local_718 [32];
  string local_6f8;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *local_6d8;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *pv;
  undefined1 local_6c8 [7];
  bool ret;
  TerminalAttributeValue value;
  Attribute attr;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  string *err_local;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *value_out_local;
  string *attr_name_local;
  TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *tattr_local;
  Stage *stage_local;
  
  if (value_out == (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"EvaluateTypedAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x88);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"`value_out` param is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,
                 (string *)
                 &attr._metas.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &attr._metas.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    bVar1 = TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::is_blocked(tattr);
    if (bVar1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Attribute is Blocked.\n");
      }
      stage_local._7_1_ = 0;
    }
    else {
      bVar1 = TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::is_value_empty(tattr);
      if (bVar1) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=((string *)err,"Attribute value is empty.\n");
        }
        stage_local._7_1_ = 0;
      }
      else {
        bVar1 = TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::is_connection(tattr);
        if (bVar1) {
          (anonymous_namespace)::
          ToAttributeConnection<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                    ((Attribute *)
                     &value._meta.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)tattr,input);
          TerminalAttributeValue::TerminalAttributeValue((TerminalAttributeValue *)local_6c8);
          t = tinyusdz::value::TimeCode::Default();
          args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pv._7_1_ = EvaluateAttribute(stage,(Attribute *)
                                             &value._meta.stringData.
                                              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       attr_name,(TerminalAttributeValue *)local_6c8,err,t,Held);
          if ((bool)pv._7_1_) {
            local_6d8 = TerminalAttributeValue::
                        as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                  ((TerminalAttributeValue *)local_6c8);
            if (local_6d8 ==
                (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
              if (err != (string *)0x0) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_718,
                           "Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}"
                           ,&local_719);
                TerminalAttributeValue::type_name_abi_cxx11_
                          (&local_740,(TerminalAttributeValue *)local_6c8);
                TypedAttribute<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                ::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (&local_6f8,(fmt *)local_718,&local_740,&local_760,attr_name,args_2);
                ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6f8);
                ::std::__cxx11::string::~string((string *)&local_6f8);
                ::std::__cxx11::string::~string((string *)&local_760);
                ::std::__cxx11::string::~string((string *)&local_740);
                ::std::__cxx11::string::~string(local_718);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_719);
              }
              pv._0_4_ = 0;
            }
            else {
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              operator=(value_out,local_6d8);
              stage_local._7_1_ = 1;
              pv._0_4_ = 1;
            }
          }
          else {
            stage_local._7_1_ = 0;
            pv._0_4_ = 1;
          }
          TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_6c8);
          Attribute::~Attribute
                    ((Attribute *)
                     &value._meta.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((int)pv != 0) goto LAB_0083ee58;
        }
        else {
          bVar1 = TypedAttribute<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                  ::get_value(tattr,value_out);
          if (bVar1) {
            stage_local._7_1_ = 1;
            goto LAB_0083ee58;
          }
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_7a0,"[Internal error] Invalid TypedAttribute? : {} \n",&local_7a1);
            fmt::format<std::__cxx11::string>
                      (local_780,(string *)local_7a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       attr_name);
            ::std::__cxx11::string::operator+=((string *)err,(string *)local_780);
            ::std::__cxx11::string::~string((string *)local_780);
            ::std::__cxx11::string::~string(local_7a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          }
        }
        stage_local._7_1_ = 0;
      }
    }
  }
LAB_0083ee58:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool EvaluateTypedAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<T> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else if (tattr.is_connection()) {

    // Follow targetPath 
    Attribute attr = ToAttributeConnection(tattr);

    //std::set<std::string> visited_paths;

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 value::TimeCode::Default(), value::TimeSampleInterpolationType::Held);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}", value.type_name(), tattr.type_name(), attr_name);
    }

  } else {
    if (tattr.get_value(value_out)) {
      return true;
    }

    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}